

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O1

void luaK_storevar(FuncState *fs,expdesc *var,expdesc *ex)

{
  expkind eVar1;
  ravi_type_map rVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  TString *pTVar7;
  LexState *ls;
  OpCode o;
  char *pcVar8;
  lua_State *plVar9;
  OpCode OVar10;
  char var_type_map_str [80];
  char acStack_c8 [80];
  char local_78 [80];
  
  eVar1 = var->k;
  if (eVar1 == VINDEXED) {
    iVar4 = luaK_exp2RK(fs,ex);
    OVar10 = OP_SETTABUP;
    if ((var->u).ind.vt == '\b') {
      rVar2 = (var->u).ind.key_ravi_type_map;
      OVar10 = OP_SETTABLE;
      if (rVar2 == 0x100) {
        iVar6 = isshortstr(fs,(int)(var->u).ind.idx);
        if ((iVar6 != 0) && (OVar10 = OP_RAVI_SETFIELD, var->ravi_type_map == 0x80)) {
          OVar10 = OP_RAVI_TABLE_SETFIELD;
        }
      }
      else if (rVar2 == 8) {
        if (var->ravi_type_map == 0x20) {
          OVar10 = (uint)(ex->ravi_type_map == 8) * 2 + OP_RAVI_IARRAY_SET;
        }
        else {
          OVar10 = OP_RAVI_SETI;
          if (var->ravi_type_map == 0x40) {
            OVar10 = (uint)(ex->ravi_type_map == 0x10) * 2 + OP_RAVI_FARRAY_SET;
          }
        }
      }
    }
    uVar5 = (uint)(var->u).ind.t;
    iVar6 = (int)(var->u).ind.idx;
    goto LAB_00145392;
  }
  if (eVar1 != VUPVAL) {
    if (eVar1 != VLOCAL) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lcode.c"
                    ,0x429,"void luaK_storevar(FuncState *, expdesc *, expdesc *)");
    }
    if (ex->k == VNONRELOC) {
      rVar2 = var->ravi_type_map;
      if ((int)rVar2 < 0x80) {
        if ((rVar2 - 8 < 0x39) && ((0x100000001000101U >> ((ulong)(rVar2 - 8) & 0x3f) & 1) != 0))
        goto LAB_001453f7;
      }
      else if ((int)rVar2 < 0x201) {
        if ((rVar2 == 0x80) || (rVar2 == 0x101)) goto LAB_001453f7;
      }
      else if ((rVar2 == 0x201) || (rVar2 == 0x401)) goto LAB_001453f7;
    }
    uVar5 = ex->ravi_type_map;
    uVar3 = 8;
    if (uVar5 != 0x20) {
      uVar3 = -(uint)(uVar5 != 0x40) | 0x10;
    }
    if (ex->k != VINDEXED) {
      uVar3 = uVar5;
    }
    uVar5 = var->ravi_type_map;
    if (uVar5 == 8) {
      if (uVar3 == 8) goto LAB_001453f7;
      if (uVar3 != 0xffffffff) {
        ls = fs->ls;
        plVar9 = ls->L;
        pcVar8 = "Invalid assignment: integer expected";
        goto LAB_001454bd;
      }
      iVar4 = luaK_exp2RK(fs,ex);
      OVar10 = OP_RAVI_TOINT;
    }
    else {
      if (uVar5 != 0x10) {
        if ((uVar5 & 0xffffff1f) == 0) {
          if (uVar3 == uVar5) goto LAB_001453f7;
          if (uVar3 == 0xffffffff) {
            OVar10 = OP_RAVI_TOIARRAY;
            if ((uVar5 & 0x20) == 0) {
              OVar10 = ((uVar5 & 0x40) == 0) + OP_RAVI_TOFARRAY;
            }
            iVar4 = luaK_exp2RK(fs,ex);
            goto LAB_001453eb;
          }
          ls = fs->ls;
          plVar9 = ls->L;
          pcVar8 = "@integer[]";
          if (uVar5 == 0x40) {
            pcVar8 = "@number[]";
          }
          pTVar7 = (TString *)0x15b1d7;
          if (uVar5 != 0x80) {
            pTVar7 = (TString *)(pcVar8 + 1);
          }
          pcVar8 = "Invalid assignment: %s expected";
        }
        else {
          if (uVar5 != 0x401) {
            if (uVar5 == 0x201) {
              if ((uVar3 & 0xfffffdfe) == 0) goto LAB_001453f7;
              if (uVar3 != 0xffffffff) {
                ls = fs->ls;
                plVar9 = ls->L;
                pcVar8 = "Invalid assignment: function expected";
                goto LAB_001454bd;
              }
              iVar4 = luaK_exp2RK(fs,ex);
              OVar10 = OP_RAVI_TOCLOSURE;
            }
            else {
              if ((uVar5 != 0x101) || ((uVar3 & 0xfffffefe) == 0)) goto LAB_001453f7;
              if (uVar3 != 0xffffffff) {
                ls = fs->ls;
                plVar9 = ls->L;
                pcVar8 = "Invalid assignment: string expected";
LAB_001454bd:
                pcVar8 = luaO_pushfstring(plVar9,pcVar8);
                goto LAB_00145566;
              }
              iVar4 = luaK_exp2RK(fs,ex);
              OVar10 = OP_RAVI_TOSTRING;
            }
            goto LAB_001453eb;
          }
          if (((uVar3 & 0xfffffbfe) == 0) &&
             ((uVar3 < 0x400 ||
              ((var->usertype != (TString *)0x0 && (var->usertype == ex->usertype))))))
          goto LAB_001453f7;
          if (uVar3 == 0xffffffff) {
            iVar4 = luaK_exp2RK(fs,ex);
            uVar5 = luaK_stringK(fs,var->usertype);
            luaK_codeABx(fs,OP_RAVI_TOTYPE,iVar4,uVar5);
            goto LAB_001453f7;
          }
          ls = fs->ls;
          plVar9 = ls->L;
          pTVar7 = (TString *)"UNKNOWN";
          if (var->usertype != (TString *)0x0) {
            pTVar7 = var->usertype + 1;
          }
          pcVar8 = "Invalid assignment: usertype %s expected";
        }
        pcVar8 = luaO_pushfstring(plVar9,pcVar8,pTVar7);
        goto LAB_00145566;
      }
      if (uVar3 == 0x10) goto LAB_001453f7;
      if (uVar3 != 0xffffffff) {
        ls = fs->ls;
        plVar9 = ls->L;
        pcVar8 = "Invalid assignment: number expected";
        goto LAB_001454bd;
      }
      iVar4 = luaK_exp2RK(fs,ex);
      OVar10 = OP_RAVI_TOFLT;
    }
LAB_001453eb:
    luaK_codeABC(fs,OVar10,iVar4,0,0);
LAB_001453f7:
    if (ex->k == VNONRELOC) {
      freereg(fs,(ex->u).info);
    }
    exp2reg(fs,ex,(var->u).info);
    return;
  }
  uVar5 = luaK_exp2anyreg(fs,ex);
  uVar3 = var->ravi_type_map;
  OVar10 = OP_SETUPVAL;
  if ((int)uVar3 < 0x80) {
    if ((uVar3 - 8 < 0x39) && ((0x100000001000101U >> ((ulong)(uVar3 - 8) & 0x3f) & 1) != 0))
    goto LAB_001450de;
  }
  else if ((int)uVar3 < 0x201) {
    if ((uVar3 == 0x80) || (uVar3 == 0x101)) {
LAB_001450de:
      if ((~uVar3 & ex->ravi_type_map) != 0) {
        if ((int)uVar3 < 0x80) {
          if ((int)uVar3 < 0x20) {
            OVar10 = OP_RAVI_SETUPVALI;
            if (uVar3 != 8) {
              if (uVar3 != 0x10) {
LAB_001454c9:
                raviY_typemap_string(uVar3,local_78);
                raviY_typemap_string(ex->ravi_type_map,acStack_c8);
                ls = fs->ls;
                pcVar8 = luaO_pushfstring(ls->L,
                                          "Invalid assignment of upvalue: upvalue type %s, expression type %s"
                                          ,local_78,acStack_c8);
LAB_00145566:
                luaX_syntaxerror(ls,pcVar8);
              }
              OVar10 = OP_RAVI_SETUPVALF;
            }
          }
          else if (uVar3 == 0x20) {
            OVar10 = OP_RAVI_SETUPVAL_IARRAY;
          }
          else {
            if (uVar3 != 0x40) goto LAB_001454c9;
            OVar10 = OP_RAVI_SETUPVAL_FARRAY;
          }
        }
        else if ((int)uVar3 < 0x201) {
          if (uVar3 == 0x80) {
            OVar10 = OP_RAVI_SETUPVALT;
          }
          else {
            if (uVar3 != 0x101) goto LAB_001454c9;
            o = OP_RAVI_TOSTRING;
LAB_00145353:
            luaK_codeABC(fs,o,uVar5,0,0);
          }
        }
        else {
          if (uVar3 == 0x201) {
            o = OP_RAVI_TOCLOSURE;
            goto LAB_00145353;
          }
          if (uVar3 != 0x401) goto LAB_001454c9;
          uVar3 = luaK_stringK(fs,fs->f->upvalues[(var->u).info].usertype);
          luaK_codeABx(fs,OP_RAVI_TOTYPE,uVar5,uVar3);
        }
      }
    }
  }
  else if ((uVar3 == 0x401) || (uVar3 == 0x201)) goto LAB_001450de;
  iVar6 = (var->u).info;
  iVar4 = 0;
LAB_00145392:
  luaK_codeABC(fs,OVar10,uVar5,iVar6,iVar4);
  if (ex->k != VNONRELOC) {
    return;
  }
  freereg(fs,(ex->u).info);
  return;
}

Assistant:

void luaK_storevar (FuncState *fs, expdesc *var, expdesc *ex) {
  switch (var->k) {
    case VLOCAL: {
      check_valid_store(fs, var, ex);
      freeexp(fs, ex);
      exp2reg(fs, ex, var->u.info);  /* compute 'ex' into proper place */
      return;
    }
    case VUPVAL: {
      int e = luaK_exp2anyreg(fs, ex);
      OpCode op = check_valid_setupval(fs, var, ex, e);
      luaK_codeABC(fs, op, e, var->u.info, 0);
      break;
    }
    case VINDEXED: {
      OpCode op;
      int e = luaK_exp2RK(fs, ex);
      if (var->u.ind.vt == VLOCAL) {
        /* table value set - if array access then use specialized versions */
        if (var->u.ind.key_ravi_type_map == RAVI_TM_INTEGER) {
          if (var->ravi_type_map == RAVI_TM_FLOAT_ARRAY) {
                op = ex->ravi_type_map == RAVI_TM_FLOAT ? OP_RAVI_FARRAY_SETF : OP_RAVI_FARRAY_SET;
          } else if (var->ravi_type_map == RAVI_TM_INTEGER_ARRAY) {
                op = ex->ravi_type_map == RAVI_TM_INTEGER ? OP_RAVI_IARRAY_SETI : OP_RAVI_IARRAY_SET;
          } else {
            op = OP_RAVI_SETI;
          }
        } else if (var->u.ind.key_ravi_type_map == RAVI_TM_STRING && isshortstr(fs, var->u.ind.idx)) {
          op = var->ravi_type_map == RAVI_TM_TABLE ? OP_RAVI_TABLE_SETFIELD : OP_RAVI_SETFIELD;
        } else {
          op = OP_SETTABLE;
        }
      } else {
        op = OP_SETTABUP;
      }
      luaK_codeABC(fs, op, var->u.ind.t, var->u.ind.idx, e);
      break;
    }
    default: lua_assert(0);  /* invalid var kind to store */
  }
  freeexp(fs, ex);
}